

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac_legacy_sig.c
# Opt level: O0

OSSL_PARAM * mac_settable_ctx_params(void *ctx,void *provctx,char *macname)

{
  EVP_MAC *pEVar1;
  OSSL_LIB_CTX *in_RDX;
  PROV_CTX *in_RSI;
  OSSL_PARAM *params;
  EVP_MAC *mac;
  EVP_MAC *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  ossl_prov_ctx_get0_libctx(in_RSI);
  pEVar1 = EVP_MAC_fetch(in_RDX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pEVar1 == (EVP_MAC *)0x0) {
    local_8 = (OSSL_PARAM *)0x0;
  }
  else {
    local_8 = EVP_MAC_settable_ctx_params(in_stack_ffffffffffffffc8);
    EVP_MAC_free((EVP_MAC *)0x34720f);
  }
  return local_8;
}

Assistant:

static const OSSL_PARAM *mac_settable_ctx_params(ossl_unused void *ctx,
                                                 void *provctx,
                                                 const char *macname)
{
    EVP_MAC *mac = EVP_MAC_fetch(PROV_LIBCTX_OF(provctx), macname,
                                 NULL);
    const OSSL_PARAM *params;

    if (mac == NULL)
        return NULL;

    params = EVP_MAC_settable_ctx_params(mac);
    EVP_MAC_free(mac);

    return params;
}